

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::processElements
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *newTypeInfo)

{
  SchemaGrammar *this_00;
  GrammarResolver *this_01;
  uint newEnclosingScope;
  uint uVar1;
  uint uVar2;
  uint newEnclosingScope_00;
  int iVar3;
  SchemaGrammar *pSVar4;
  SchemaElementDecl *this_02;
  undefined4 extraout_var;
  Grammar *pGVar5;
  XMLCh *text1;
  SchemaElementDecl *this_03;
  ComplexTypeInfo *pCVar6;
  ComplexTypeInfo *pCVar7;
  DatatypeValidator *pDVar8;
  DatatypeValidator *pDVar9;
  SchemaElementDecl *other;
  XMLCh *localPart;
  Grammar *aGrammar_1;
  uint elemScope;
  int elemURI;
  SchemaElementDecl *elemDecl;
  SchemaGrammar *aGrammar;
  XMLSize_t i;
  int schemaURI;
  int newTypeScope;
  XMLSize_t elemCount;
  NamespaceScopeManager nsMgr;
  ComplexTypeInfo *newTypeInfo_local;
  ComplexTypeInfo *baseTypeInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  undefined4 extraout_var_00;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)newTypeInfo;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&elemCount,elem,this->fSchemaInfo,this);
  pSVar4 = (SchemaGrammar *)ComplexTypeInfo::elementCount(baseTypeInfo);
  if (pSVar4 != (SchemaGrammar *)0x0) {
    newEnclosingScope = ComplexTypeInfo::getScopeDefined((ComplexTypeInfo *)nsMgr.fSchemaInfo);
    uVar1 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                      (this->fURIStringPool,SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    for (aGrammar = (SchemaGrammar *)0x0; aGrammar < pSVar4;
        aGrammar = (SchemaGrammar *)
                   ((long)&(aGrammar->super_Grammar).super_XSerializable._vptr_XSerializable + 1)) {
      this_00 = this->fSchemaGrammar;
      this_02 = ComplexTypeInfo::elementAt(baseTypeInfo,(XMLSize_t)aGrammar);
      uVar2 = XMLElementDecl::getURI(&this_02->super_XMLElementDecl);
      newEnclosingScope_00 = SchemaElementDecl::getEnclosingScope(this_02);
      if (newEnclosingScope_00 == 0xfffffffe) {
LAB_0043e952:
        ComplexTypeInfo::addElement((ComplexTypeInfo *)nsMgr.fSchemaInfo,this_02);
      }
      else if (((uVar2 == this->fTargetNSURI) || (uVar2 == uVar1)) ||
              (uVar2 == this->fEmptyNamespaceURI)) {
LAB_0043e818:
        text1 = XMLElementDecl::getBaseName(&this_02->super_XMLElementDecl);
        iVar3 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                          (this_00,(ulong)uVar2,text1,0,(ulong)newEnclosingScope);
        this_03 = (SchemaElementDecl *)CONCAT44(extraout_var_00,iVar3);
        if (this_03 == (SchemaElementDecl *)0x0) {
          SchemaElementDecl::setEnclosingScope(this_02,newEnclosingScope);
          SchemaGrammar::putGroupElemDecl(this_00,&this_02->super_XMLElementDecl);
          SchemaElementDecl::setEnclosingScope(this_02,newEnclosingScope_00);
          goto LAB_0043e952;
        }
        pCVar6 = SchemaElementDecl::getComplexTypeInfo(this_02);
        pCVar7 = SchemaElementDecl::getComplexTypeInfo(this_03);
        if (pCVar6 == pCVar7) {
          pDVar8 = SchemaElementDecl::getDatatypeValidator(this_02);
          pDVar9 = SchemaElementDecl::getDatatypeValidator(this_03);
          if (pDVar8 == pDVar9) goto LAB_0043e963;
        }
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x43,text1,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        this_01 = this->fGrammarResolver;
        iVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                          (this->fURIStringPool,(ulong)uVar2);
        pGVar5 = GrammarResolver::getGrammar(this_01,(XMLCh *)CONCAT44(extraout_var,iVar3));
        if ((pGVar5 != (Grammar *)0x0) &&
           (iVar3 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[5])(), iVar3 == 1))
        goto LAB_0043e818;
      }
LAB_0043e963:
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&elemCount);
  return;
}

Assistant:

void TraverseSchema::processElements(const DOMElement* const elem,
                                     ComplexTypeInfo* const baseTypeInfo,
                                     ComplexTypeInfo* const newTypeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    XMLSize_t elemCount = baseTypeInfo->elementCount();

    if (elemCount) {

        int newTypeScope = newTypeInfo->getScopeDefined();
        int schemaURI = fURIStringPool->addOrFind(SchemaSymbols::fgURI_SCHEMAFORSCHEMA);

        for (XMLSize_t i=0; i < elemCount; i++) {

            SchemaGrammar*     aGrammar = fSchemaGrammar;
            SchemaElementDecl* elemDecl = baseTypeInfo->elementAt(i);
            int elemURI = elemDecl->getURI();
            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                if (elemURI != fTargetNSURI && elemURI != schemaURI && elemURI != fEmptyNamespaceURI) {
                    Grammar* aGrammar = fGrammarResolver->getGrammar(fURIStringPool->getValueForId(elemURI));

                    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
                        continue; // REVISIT - error message
                    }
                }

                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                    aGrammar->getElemDecl(elemURI, localPart, 0, newTypeScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }
                elemDecl->setEnclosingScope(newTypeScope);
                ((SchemaGrammar*) aGrammar)->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            newTypeInfo->addElement(elemDecl);
        }
    }
}